

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O2

DdNode * extraZddSymmPairsCompute(DdManager *dd,DdNode *bFunc,DdNode *bVars)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *bFunc_00;
  DdNode *P;
  DdNode *Q;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  bool bVar7;
  
  pDVar6 = (DdNode *)((ulong)bFunc & 0xfffffffffffffffe);
  if (pDVar6->index == 0x7fffffff) {
    iVar2 = Extra_bddSuppSize(dd,bVars);
    if (1 < iVar2) {
      iVar2 = iVar2 + -2;
      pDVar6 = bVars;
      while (bVar7 = iVar2 != 0, iVar2 = iVar2 + -1, bVar7) {
        pDVar6 = (pDVar6->type).kids.T;
      }
      pDVar6 = extraZddTuplesFromBdd(dd,pDVar6,bVars);
      return pDVar6;
    }
    return dd->zero;
  }
  if (dd->one == bVars) {
    __assert_fail("bVars != b1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddSymm.c"
                  ,0x25f,"DdNode *extraZddSymmPairsCompute(DdManager *, DdNode *, DdNode *)");
  }
  pDVar3 = cuddCacheLookup2Zdd(dd,extraZddSymmPairsCompute,bFunc,bVars);
  if (pDVar3 != (DdNode *)0x0) {
    return pDVar3;
  }
  iVar2 = 0;
  pDVar3 = bVars;
  while (dd->perm[pDVar3->index] < dd->perm[pDVar6->index]) {
    pDVar3 = (pDVar3->type).kids.T;
    iVar2 = iVar2 + -1;
  }
  if (pDVar6->index != pDVar3->index) {
    __assert_fail("bFR->index == bVarsNew->index",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddSymm.c"
                  ,0x274,"DdNode *extraZddSymmPairsCompute(DdManager *, DdNode *, DdNode *)");
  }
  pDVar5 = (pDVar6->type).kids.E;
  if (pDVar6 == bFunc) {
    bFunc_00 = (pDVar6->type).kids.T;
  }
  else {
    pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
    bFunc_00 = (DdNode *)((ulong)(pDVar6->type).kids.T ^ 1);
  }
  P = extraZddSymmPairsCompute(dd,pDVar5,(pDVar3->type).kids.T);
  if (P == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)P & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  if (P != dd->zero) {
    Q = extraZddSymmPairsCompute(dd,bFunc_00,(pDVar3->type).kids.T);
    if (Q == (DdNode *)0x0) goto LAB_006854de;
    piVar1 = (int *)(((ulong)Q & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar4 = cuddZddIntersect(dd,P,Q);
    if (pDVar4 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,P);
      P = Q;
      goto LAB_006854de;
    }
    piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDerefZdd(dd,P);
    Cudd_RecursiveDerefZdd(dd,Q);
    P = pDVar4;
  }
  pDVar3 = extraZddGetSymmetricVars(dd,bFunc_00,pDVar5,(pDVar3->type).kids.T);
  if (pDVar3 == (DdNode *)0x0) goto LAB_006854de;
  piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  if (pDVar3 != dd->zero) {
    pDVar6 = cuddZddGetNode(dd,pDVar6->index * 2,pDVar3,dd->zero);
    if (pDVar6 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,P);
      P = pDVar3;
      goto LAB_006854de;
    }
    piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + -1;
    pDVar5 = cuddZddUnion(dd,P,pDVar6);
    if (pDVar5 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,P);
      P = pDVar6;
      goto LAB_006854de;
    }
    piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDerefZdd(dd,P);
    pDVar3 = pDVar6;
    P = pDVar5;
  }
  Cudd_RecursiveDerefZdd(dd,pDVar3);
  pDVar6 = P;
  if (iVar2 != 0) {
    pDVar3 = extraBddReduceVarSet(dd,bVars,bFunc);
    if (pDVar3 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      iVar2 = Extra_bddSuppSize(dd,pDVar3);
      if (iVar2 < 2) {
        Cudd_RecursiveDeref(dd,pDVar3);
        goto LAB_006854a9;
      }
      iVar2 = iVar2 + -2;
      pDVar6 = pDVar3;
      while (bVar7 = iVar2 != 0, iVar2 = iVar2 + -1, bVar7) {
        pDVar6 = (pDVar6->type).kids.T;
      }
      pDVar5 = extraZddTuplesFromBdd(dd,pDVar6,pDVar3);
      if (pDVar5 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar3);
      }
      else {
        piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,pDVar3);
        pDVar6 = cuddZddUnion(dd,P,pDVar5);
        if (pDVar6 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDerefZdd(dd,P);
          Cudd_RecursiveDerefZdd(dd,pDVar5);
          goto LAB_006854a9;
        }
        Cudd_RecursiveDerefZdd(dd,P);
        P = pDVar5;
      }
    }
LAB_006854de:
    Cudd_RecursiveDerefZdd(dd,P);
    return (DdNode *)0x0;
  }
LAB_006854a9:
  piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + -1;
  cuddCacheInsert2(dd,extraZddSymmPairsCompute,bFunc,bVars,pDVar6);
  return pDVar6;
}

Assistant:

DdNode * 
extraZddSymmPairsCompute( 
  DdManager * dd,   /* the manager */
  DdNode * bFunc,   /* the function whose symmetries are computed */
  DdNode * bVars )  /* the set of variables on which this function depends */
{
    DdNode * zRes;
    DdNode * bFR = Cudd_Regular(bFunc); 

    if ( cuddIsConstant(bFR) )
    {
        int nVars, i;

        // determine how many vars are in the bVars
        nVars = Extra_bddSuppSize( dd, bVars );
        if ( nVars < 2 )
            return z0;
        else
        {
            DdNode * bVarsK;

            // create the BDD bVarsK corresponding to K = 2;
            bVarsK = bVars;
            for ( i = 0; i < nVars-2; i++ )
                bVarsK = cuddT( bVarsK );
            return extraZddTuplesFromBdd( dd, bVarsK, bVars );
        }
    }
    assert( bVars != b1 );

    if ( (zRes = cuddCacheLookup2Zdd(dd, extraZddSymmPairsCompute, bFunc, bVars)) )
        return zRes;
    else
    {
        DdNode * zRes0, * zRes1;
        DdNode * zTemp, * zPlus, * zSymmVars;             
        DdNode * bF0, * bF1;             
        DdNode * bVarsNew;
        int nVarsExtra;
        int LevelF;

        // every variable in bF should be also in bVars, therefore LevelF cannot be above LevelV
        // if LevelF is below LevelV, scroll through the vars in bVars to the same level as F
        // count how many extra vars are there in bVars
        nVarsExtra = 0;
        LevelF = dd->perm[bFR->index];
        for ( bVarsNew = bVars; LevelF > dd->perm[bVarsNew->index]; bVarsNew = cuddT(bVarsNew) )
            nVarsExtra++; 
        // the indexes (level) of variables should be synchronized now
        assert( bFR->index == bVarsNew->index );

        // cofactor the function
        if ( bFR != bFunc ) // bFunc is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }

        // solve subproblems
        zRes0 = extraZddSymmPairsCompute( dd, bF0, cuddT(bVarsNew) );
        if ( zRes0 == NULL )
            return NULL;
        cuddRef( zRes0 );

        // if there is no symmetries in the negative cofactor
        // there is no need to test the positive cofactor
        if ( zRes0 == z0 )
            zRes = zRes0;  // zRes takes reference
        else
        {
            zRes1 = extraZddSymmPairsCompute( dd, bF1, cuddT(bVarsNew) );
            if ( zRes1 == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                return NULL;
            }
            cuddRef( zRes1 );

            // only those variables are pair-wise symmetric 
            // that are pair-wise symmetric in both cofactors
            // therefore, intersect the solutions
            zRes = cuddZddIntersect( dd, zRes0, zRes1 );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                Cudd_RecursiveDerefZdd( dd, zRes1 );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zRes0 );
            Cudd_RecursiveDerefZdd( dd, zRes1 );
        }

        // consider the current top-most variable and find all the vars
        // that are pairwise symmetric with it
        // these variables are returned as a set of ZDD singletons
        zSymmVars = extraZddGetSymmetricVars( dd, bF1, bF0, cuddT(bVarsNew) );
        if ( zSymmVars == NULL )
        {
            Cudd_RecursiveDerefZdd( dd, zRes );
            return NULL;
        }
        cuddRef( zSymmVars );

        // attach the topmost variable to the set, to get the variable pairs
        // use the positive polarity ZDD variable for the purpose

        // there is no need to do so, if zSymmVars is empty
        if ( zSymmVars == z0 )
            Cudd_RecursiveDerefZdd( dd, zSymmVars );
        else
        {
            zPlus = cuddZddGetNode( dd, 2*bFR->index, zSymmVars, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                Cudd_RecursiveDerefZdd( dd, zSymmVars );
                return NULL;
            }
            cuddRef( zPlus );
            cuddDeref( zSymmVars );

            // add these variable pairs to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }

        // only zRes is referenced at this point

        // if we skipped some variables, these variables cannot be symmetric with
        // any variables that are currently in the support of bF, but they can be 
        // symmetric with the variables that are in bVars but not in the support of bF
        if ( nVarsExtra )
        {
            // it is possible to improve this step:
            // (1) there is no need to enter here, if nVarsExtra < 2

            // create the set of topmost nVarsExtra in bVars
            DdNode * bVarsExtra;
            int nVars;

            // remove from bVars all the variable that are in the support of bFunc
            bVarsExtra = extraBddReduceVarSet( dd, bVars, bFunc );  
            if ( bVarsExtra == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( bVarsExtra );

            // determine how many vars are in the bVarsExtra
            nVars = Extra_bddSuppSize( dd, bVarsExtra );
            if ( nVars < 2 )
            {
                Cudd_RecursiveDeref( dd, bVarsExtra );
            }
            else
            {
                int i;
                DdNode * bVarsK;

                // create the BDD bVarsK corresponding to K = 2;
                bVarsK = bVarsExtra;
                for ( i = 0; i < nVars-2; i++ )
                    bVarsK = cuddT( bVarsK );

                // create the 2 variable tuples
                zPlus = extraZddTuplesFromBdd( dd, bVarsK, bVarsExtra );
                if ( zPlus == NULL )
                {
                    Cudd_RecursiveDeref( dd, bVarsExtra );
                    Cudd_RecursiveDerefZdd( dd, zRes );
                    return NULL;
                }
                cuddRef( zPlus );
                Cudd_RecursiveDeref( dd, bVarsExtra );

                // add these to the result
                zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
                if ( zRes == NULL )
                {
                    Cudd_RecursiveDerefZdd( dd, zTemp );
                    Cudd_RecursiveDerefZdd( dd, zPlus );
                    return NULL;
                }
                cuddRef( zRes );
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
            }
        }
        cuddDeref( zRes );


        /* insert the result into cache */
        cuddCacheInsert2(dd, extraZddSymmPairsCompute, bFunc, bVars, zRes);
        return zRes;
    }
}